

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_binary.c
# Opt level: O3

log_policy_interface log_policy_format_binary_interface(void)

{
  return &log_policy_format_binary_interface::policy_interface_format;
}

Assistant:

log_policy_interface log_policy_format_binary_interface(void)
{
	static struct log_policy_format_impl_type log_policy_format_binary_impl_obj = {
		&log_policy_format_binary_size,
		&log_policy_format_binary_serialize,
		&log_policy_format_binary_deserialize
	};

	static struct log_policy_interface_type policy_interface_format = {
		&log_policy_format_binary_create,
		&log_policy_format_binary_impl_obj,
		&log_policy_format_binary_destroy
	};

	return &policy_interface_format;
}